

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerHLSL::emit_subgroup_op(CompilerHLSL *this,Instruction *i)

{
  uint16_t uVar1;
  uint32_t uVar2;
  uint32_t result_id;
  bool bVar3;
  uint32_t uVar4;
  CompilerError *pCVar5;
  string *psVar6;
  char (*in_R9) [2];
  char (*in_stack_fffffffffffff6b8) [26];
  char (*in_stack_fffffffffffff6c0) [2];
  uint32_t direction;
  GroupOperation operation_16;
  GroupOperation operation_15;
  GroupOperation operation_14;
  bool forward_12;
  GroupOperation operation_13;
  bool forward_11;
  GroupOperation operation_12;
  bool forward_10;
  GroupOperation operation_11;
  GroupOperation operation_10;
  GroupOperation operation_9;
  GroupOperation operation_8;
  GroupOperation operation_7;
  string local_658;
  string local_638;
  byte local_615;
  uint32_t local_614;
  undefined1 local_610 [3];
  bool forward_9;
  GroupOperation operation_6;
  string local_5f0;
  string local_5d0;
  byte local_5a9;
  uint32_t local_5a8;
  bool forward_8;
  GroupOperation operation_5;
  uint32_t local_578;
  bool forward_7;
  GroupOperation operation_4;
  uint32_t local_54c;
  undefined1 local_548 [3];
  bool forward_6;
  GroupOperation operation_3;
  string local_528;
  string local_508;
  byte local_4e5;
  uint32_t local_4e4;
  undefined1 local_4e0 [3];
  bool forward_5;
  GroupOperation operation_2;
  string local_4c0;
  string local_4a0;
  byte local_47d;
  uint32_t local_47c;
  undefined1 local_478 [3];
  bool forward_4;
  GroupOperation operation_1;
  string local_458;
  string local_438;
  byte local_411;
  undefined1 local_410 [7];
  bool forward_3;
  string local_3f0;
  string local_3d0;
  byte local_3a9;
  undefined1 local_3a8 [7];
  bool forward_2;
  string local_388;
  string local_368;
  byte local_341;
  undefined1 local_340 [7];
  bool forward_1;
  string local_320;
  string local_300;
  undefined1 local_2e0 [8];
  string right_2;
  string local_2a0;
  undefined1 local_280 [8];
  string left_2;
  string local_240;
  string local_220;
  undefined1 local_200 [8];
  string right_1;
  string local_1c0;
  undefined1 local_1a0 [8];
  string left_1;
  string local_160;
  string local_140;
  undefined1 local_120 [8];
  string right;
  string local_e0;
  undefined1 local_c0 [8];
  string left;
  bool forward;
  GroupOperation operation;
  BaseType local_6c;
  BaseType local_68;
  BaseType uint_type;
  BaseType int_type;
  uint32_t integer_width;
  anon_class_16_2_633b9ddf make_inclusive_Product;
  anon_class_16_2_633b9ddf make_inclusive_Sum;
  Scope scope;
  uint32_t id;
  uint32_t result_type;
  Op op;
  uint32_t *ops;
  Instruction *local_18;
  Instruction *i_local;
  CompilerHLSL *this_local;
  
  local_18 = i;
  i_local = (Instruction *)this;
  if ((this->hlsl_options).shader_model < 0x3c) {
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar5,"Wave ops requires SM 6.0 or higher.");
    __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  _result_type = (_func_int **)Compiler::stream((Compiler *)this,i);
  uVar1 = local_18->op;
  uVar2 = *(uint32_t *)_result_type;
  result_id = *(uint32_t *)((long)_result_type + 4);
  uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,*(uint32_t *)(_result_type + 1));
  if (uVar4 == 3) {
    make_inclusive_Product.this = (CompilerHLSL *)&result_type;
    _int_type = this;
    make_inclusive_Product.ops = (uint32_t **)this;
    uint_type = CompilerGLSL::get_integer_width_for_instruction(&this->super_CompilerGLSL,local_18);
    local_68 = to_signed_basetype(uint_type);
    local_6c = to_unsigned_basetype(uint_type);
    switch(uVar1) {
    case 0x14d:
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&operation,"WaveIsFirstLane()",(allocator *)&forward)
      ;
      CompilerGLSL::emit_op
                (&this->super_CompilerGLSL,uVar2,result_id,(string *)&operation,true,false);
      ::std::__cxx11::string::~string((string *)&operation);
      ::std::allocator<char>::~allocator((allocator<char> *)&forward);
      break;
    case 0x14e:
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)((long)_result_type + 0xc),
                 "WaveActiveAllTrue");
      break;
    case 0x14f:
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)((long)_result_type + 0xc),
                 "WaveActiveAnyTrue");
      break;
    case 0x150:
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)((long)_result_type + 0xc),
                 "WaveActiveAllEqual");
      break;
    case 0x151:
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)((long)_result_type + 0xc),
                 *(uint32_t *)(_result_type + 2),"WaveReadLaneAt");
      break;
    case 0x152:
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)((long)_result_type + 0xc),
                 "WaveReadLaneFirst");
      break;
    case 0x153:
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)((long)_result_type + 0xc),
                 "WaveActiveBallot");
      break;
    case 0x154:
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar5,"Cannot trivially implement InverseBallot in HLSL.");
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    case 0x155:
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar5,"Cannot trivially implement BallotBitExtract in HLSL.");
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    case 0x156:
      uVar4 = *(uint32_t *)((long)_result_type + 0xc);
      left.field_2._M_local_buf[0xf] =
           CompilerGLSL::should_forward(&this->super_CompilerGLSL,*(uint32_t *)(_result_type + 2));
      if (uVar4 == 0) {
        CompilerGLSL::to_enclosed_expression_abi_cxx11_
                  (&local_e0,&this->super_CompilerGLSL,*(uint32_t *)(_result_type + 2),true);
        CompilerGLSL::to_enclosed_expression_abi_cxx11_
                  ((string *)((long)&right.field_2 + 8),&this->super_CompilerGLSL,
                   *(uint32_t *)(_result_type + 2),true);
        join<char_const(&)[11],std::__cxx11::string,char_const(&)[17],std::__cxx11::string,char_const(&)[4]>
                  ((string *)local_c0,(spirv_cross *)0x59862d,(char (*) [11])&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x598627,
                   (char (*) [17])((long)&right.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x59864e,
                   (char (*) [4])in_stack_fffffffffffff6b8);
        ::std::__cxx11::string::~string((string *)(right.field_2._M_local_buf + 8));
        ::std::__cxx11::string::~string((string *)&local_e0);
        CompilerGLSL::to_enclosed_expression_abi_cxx11_
                  (&local_140,&this->super_CompilerGLSL,*(uint32_t *)(_result_type + 2),true);
        CompilerGLSL::to_enclosed_expression_abi_cxx11_
                  (&local_160,&this->super_CompilerGLSL,*(uint32_t *)(_result_type + 2),true);
        psVar6 = &local_160;
        join<char_const(&)[11],std::__cxx11::string,char_const(&)[17],std::__cxx11::string,char_const(&)[4]>
                  ((string *)local_120,(spirv_cross *)0x59862d,(char (*) [11])&local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x598668,
                   (char (*) [17])psVar6,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x59868f,
                   (char (*) [4])in_stack_fffffffffffff6b8);
        ::std::__cxx11::string::~string((string *)&local_160);
        ::std::__cxx11::string::~string((string *)&local_140);
        join<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&>
                  ((string *)((long)&left_1.field_2 + 8),(spirv_cross *)local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x59fa75,
                   (char (*) [4])local_120,psVar6);
        CompilerGLSL::emit_op
                  (&this->super_CompilerGLSL,uVar2,result_id,(string *)((long)&left_1.field_2 + 8),
                   (bool)(left.field_2._M_local_buf[0xf] & 1),false);
        ::std::__cxx11::string::~string((string *)(left_1.field_2._M_local_buf + 8));
        Compiler::inherit_expression_dependencies
                  ((Compiler *)this,result_id,*(uint32_t *)(_result_type + 2));
        ::std::__cxx11::string::~string((string *)local_120);
        ::std::__cxx11::string::~string((string *)local_c0);
      }
      else if (uVar4 == 1) {
        CompilerGLSL::to_enclosed_expression_abi_cxx11_
                  (&local_1c0,&this->super_CompilerGLSL,*(uint32_t *)(_result_type + 2),true);
        CompilerGLSL::to_enclosed_expression_abi_cxx11_
                  ((string *)((long)&right_1.field_2 + 8),&this->super_CompilerGLSL,
                   *(uint32_t *)(_result_type + 2),true);
        join<char_const(&)[11],std::__cxx11::string,char_const(&)[39],std::__cxx11::string,char_const(&)[26]>
                  ((string *)local_1a0,(spirv_cross *)0x59862d,(char (*) [11])&local_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ".x & gl_SubgroupLeMask.x) + countbits(",
                   (char (*) [39])((long)&right_1.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ".y & gl_SubgroupLeMask.y)",in_stack_fffffffffffff6b8);
        ::std::__cxx11::string::~string((string *)(right_1.field_2._M_local_buf + 8));
        ::std::__cxx11::string::~string((string *)&local_1c0);
        CompilerGLSL::to_enclosed_expression_abi_cxx11_
                  (&local_220,&this->super_CompilerGLSL,*(uint32_t *)(_result_type + 2),true);
        CompilerGLSL::to_enclosed_expression_abi_cxx11_
                  (&local_240,&this->super_CompilerGLSL,*(uint32_t *)(_result_type + 2),true);
        psVar6 = &local_240;
        join<char_const(&)[11],std::__cxx11::string,char_const(&)[39],std::__cxx11::string,char_const(&)[26]>
                  ((string *)local_200,(spirv_cross *)0x59862d,(char (*) [11])&local_220,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ".z & gl_SubgroupLeMask.z) + countbits(",(char (*) [39])psVar6,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ".w & gl_SubgroupLeMask.w)",in_stack_fffffffffffff6b8);
        ::std::__cxx11::string::~string((string *)&local_240);
        ::std::__cxx11::string::~string((string *)&local_220);
        join<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&>
                  ((string *)((long)&left_2.field_2 + 8),(spirv_cross *)local_1a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x59fa75,
                   (char (*) [4])local_200,psVar6);
        CompilerGLSL::emit_op
                  (&this->super_CompilerGLSL,uVar2,result_id,(string *)((long)&left_2.field_2 + 8),
                   (bool)(left.field_2._M_local_buf[0xf] & 1),false);
        ::std::__cxx11::string::~string((string *)(left_2.field_2._M_local_buf + 8));
        bVar3 = Bitset::get(&(this->super_CompilerGLSL).super_Compiler.active_input_builtins,0x1143)
        ;
        if (!bVar3) {
          Bitset::set(&(this->super_CompilerGLSL).super_Compiler.active_input_builtins,0x1143);
          Compiler::force_recompile_guarantee_forward_progress((Compiler *)this);
        }
        ::std::__cxx11::string::~string((string *)local_200);
        ::std::__cxx11::string::~string((string *)local_1a0);
      }
      else {
        if (uVar4 != 2) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar5,"Invalid BitCount operation.");
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        CompilerGLSL::to_enclosed_expression_abi_cxx11_
                  (&local_2a0,&this->super_CompilerGLSL,*(uint32_t *)(_result_type + 2),true);
        CompilerGLSL::to_enclosed_expression_abi_cxx11_
                  ((string *)((long)&right_2.field_2 + 8),&this->super_CompilerGLSL,
                   *(uint32_t *)(_result_type + 2),true);
        join<char_const(&)[11],std::__cxx11::string,char_const(&)[39],std::__cxx11::string,char_const(&)[26]>
                  ((string *)local_280,(spirv_cross *)0x59862d,(char (*) [11])&local_2a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ".x & gl_SubgroupLtMask.x) + countbits(",
                   (char (*) [39])((long)&right_2.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ".y & gl_SubgroupLtMask.y)",in_stack_fffffffffffff6b8);
        ::std::__cxx11::string::~string((string *)(right_2.field_2._M_local_buf + 8));
        ::std::__cxx11::string::~string((string *)&local_2a0);
        CompilerGLSL::to_enclosed_expression_abi_cxx11_
                  (&local_300,&this->super_CompilerGLSL,*(uint32_t *)(_result_type + 2),true);
        CompilerGLSL::to_enclosed_expression_abi_cxx11_
                  (&local_320,&this->super_CompilerGLSL,*(uint32_t *)(_result_type + 2),true);
        psVar6 = &local_320;
        join<char_const(&)[11],std::__cxx11::string,char_const(&)[39],std::__cxx11::string,char_const(&)[26]>
                  ((string *)local_2e0,(spirv_cross *)0x59862d,(char (*) [11])&local_300,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ".z & gl_SubgroupLtMask.z) + countbits(",(char (*) [39])psVar6,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ".w & gl_SubgroupLtMask.w)",in_stack_fffffffffffff6b8);
        ::std::__cxx11::string::~string((string *)&local_320);
        ::std::__cxx11::string::~string((string *)&local_300);
        join<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&>
                  ((string *)local_340,(spirv_cross *)local_280,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x59fa75,
                   (char (*) [4])local_2e0,psVar6);
        CompilerGLSL::emit_op
                  (&this->super_CompilerGLSL,uVar2,result_id,(string *)local_340,
                   (bool)(left.field_2._M_local_buf[0xf] & 1),false);
        ::std::__cxx11::string::~string((string *)local_340);
        bVar3 = Bitset::get(&(this->super_CompilerGLSL).super_Compiler.active_input_builtins,0x1144)
        ;
        if (!bVar3) {
          Bitset::set(&(this->super_CompilerGLSL).super_Compiler.active_input_builtins,0x1144);
          Compiler::force_recompile_guarantee_forward_progress((Compiler *)this);
        }
        ::std::__cxx11::string::~string((string *)local_2e0);
        ::std::__cxx11::string::~string((string *)local_280);
      }
      break;
    case 0x157:
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar5,"Cannot trivially implement BallotFindLSB in HLSL.");
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    case 0x158:
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar5,"Cannot trivially implement BallotFindMSB in HLSL.");
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    case 0x159:
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)((long)_result_type + 0xc),
                 *(uint32_t *)(_result_type + 2),"WaveReadLaneAt");
      break;
    case 0x15a:
      local_341 = CompilerGLSL::should_forward
                            (&this->super_CompilerGLSL,*(uint32_t *)((long)_result_type + 0xc));
      uVar2 = *(uint32_t *)_result_type;
      uVar4 = *(uint32_t *)((long)_result_type + 4);
      CompilerGLSL::to_unpacked_expression_abi_cxx11_
                (&local_388,&this->super_CompilerGLSL,*(uint32_t *)((long)_result_type + 0xc),true);
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                ((string *)local_3a8,&this->super_CompilerGLSL,*(uint32_t *)(_result_type + 2),true)
      ;
      join<char_const(&)[16],std::__cxx11::string,char_const(&)[3],char_const(&)[22],std::__cxx11::string,char_const(&)[2]>
                (&local_368,(spirv_cross *)"WaveReadLaneAt(",(char (*) [16])&local_388,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a8753,
                 (char (*) [3])"WaveGetLaneIndex() ^ ",(char (*) [22])local_3a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5b7d4b,
                 in_stack_fffffffffffff6c0);
      CompilerGLSL::emit_op
                (&this->super_CompilerGLSL,uVar2,uVar4,&local_368,(bool)(local_341 & 1),false);
      ::std::__cxx11::string::~string((string *)&local_368);
      ::std::__cxx11::string::~string((string *)local_3a8);
      ::std::__cxx11::string::~string((string *)&local_388);
      Compiler::inherit_expression_dependencies
                ((Compiler *)this,*(uint32_t *)((long)_result_type + 4),
                 *(uint32_t *)((long)_result_type + 0xc));
      break;
    case 0x15b:
      local_3a9 = CompilerGLSL::should_forward
                            (&this->super_CompilerGLSL,*(uint32_t *)((long)_result_type + 0xc));
      uVar2 = *(uint32_t *)_result_type;
      uVar4 = *(uint32_t *)((long)_result_type + 4);
      CompilerGLSL::to_unpacked_expression_abi_cxx11_
                (&local_3f0,&this->super_CompilerGLSL,*(uint32_t *)((long)_result_type + 0xc),true);
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                ((string *)local_410,&this->super_CompilerGLSL,*(uint32_t *)(_result_type + 2),true)
      ;
      join<char_const(&)[16],std::__cxx11::string,char_const(&)[3],char_const(&)[22],std::__cxx11::string,char_const(&)[2]>
                (&local_3d0,(spirv_cross *)"WaveReadLaneAt(",(char (*) [16])&local_3f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a8753,
                 (char (*) [3])"WaveGetLaneIndex() - ",(char (*) [22])local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5b7d4b,
                 in_stack_fffffffffffff6c0);
      CompilerGLSL::emit_op
                (&this->super_CompilerGLSL,uVar2,uVar4,&local_3d0,(bool)(local_3a9 & 1),false);
      ::std::__cxx11::string::~string((string *)&local_3d0);
      ::std::__cxx11::string::~string((string *)local_410);
      ::std::__cxx11::string::~string((string *)&local_3f0);
      Compiler::inherit_expression_dependencies
                ((Compiler *)this,*(uint32_t *)((long)_result_type + 4),
                 *(uint32_t *)((long)_result_type + 0xc));
      break;
    case 0x15c:
      local_411 = CompilerGLSL::should_forward
                            (&this->super_CompilerGLSL,*(uint32_t *)((long)_result_type + 0xc));
      uVar2 = *(uint32_t *)_result_type;
      uVar4 = *(uint32_t *)((long)_result_type + 4);
      CompilerGLSL::to_unpacked_expression_abi_cxx11_
                (&local_458,&this->super_CompilerGLSL,*(uint32_t *)((long)_result_type + 0xc),true);
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                ((string *)local_478,&this->super_CompilerGLSL,*(uint32_t *)(_result_type + 2),true)
      ;
      join<char_const(&)[16],std::__cxx11::string,char_const(&)[3],char_const(&)[22],std::__cxx11::string,char_const(&)[2]>
                (&local_438,(spirv_cross *)"WaveReadLaneAt(",(char (*) [16])&local_458,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a8753,
                 (char (*) [3])"WaveGetLaneIndex() + ",(char (*) [22])local_478,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5b7d4b,
                 in_stack_fffffffffffff6c0);
      CompilerGLSL::emit_op
                (&this->super_CompilerGLSL,uVar2,uVar4,&local_438,(bool)(local_411 & 1),false);
      ::std::__cxx11::string::~string((string *)&local_438);
      ::std::__cxx11::string::~string((string *)local_478);
      ::std::__cxx11::string::~string((string *)&local_458);
      Compiler::inherit_expression_dependencies
                ((Compiler *)this,*(uint32_t *)((long)_result_type + 4),
                 *(uint32_t *)((long)_result_type + 0xc));
      break;
    case 0x15d:
      local_5a8 = *(uint32_t *)((long)_result_type + 0xc);
      if (local_5a8 == 0) {
        CompilerGLSL::emit_unary_func_op
                  (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)(_result_type + 2),
                   "WaveActiveSum");
      }
      else if (local_5a8 == 1) {
        local_5a9 = CompilerGLSL::should_forward
                              (&this->super_CompilerGLSL,*(uint32_t *)(_result_type + 2));
        CompilerGLSL::to_expression_abi_cxx11_
                  ((string *)local_610,&this->super_CompilerGLSL,*(uint32_t *)(_result_type + 2),
                   true);
        join<char_const(&)[14],char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_5f0,(spirv_cross *)"WavePrefixSum",(char (*) [14])0x5ac375,
                   (char (*) [2])local_610,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5b7d4b,
                   in_R9);
        emit_subgroup_op::anon_class_16_2_633b9ddf::operator()
                  (&local_5d0,(anon_class_16_2_633b9ddf *)&make_inclusive_Product.ops,&local_5f0);
        CompilerGLSL::emit_op
                  (&this->super_CompilerGLSL,uVar2,result_id,&local_5d0,(bool)(local_5a9 & 1),false)
        ;
        ::std::__cxx11::string::~string((string *)&local_5d0);
        ::std::__cxx11::string::~string((string *)&local_5f0);
        ::std::__cxx11::string::~string((string *)local_610);
        Compiler::inherit_expression_dependencies
                  ((Compiler *)this,result_id,*(uint32_t *)(_result_type + 2));
      }
      else {
        if (local_5a8 != 2) {
          if (local_5a8 != 3) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Invalid group operation.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar5,"Cannot trivially implement ClusteredReduce in HLSL.")
          ;
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        CompilerGLSL::emit_unary_func_op
                  (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)(_result_type + 2),
                   "WavePrefixSum");
      }
      break;
    case 0x15e:
      local_47c = *(uint32_t *)((long)_result_type + 0xc);
      if (local_47c == 0) {
        CompilerGLSL::emit_unary_func_op
                  (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)(_result_type + 2),
                   "WaveActiveSum");
      }
      else if (local_47c == 1) {
        local_47d = CompilerGLSL::should_forward
                              (&this->super_CompilerGLSL,*(uint32_t *)(_result_type + 2));
        CompilerGLSL::to_expression_abi_cxx11_
                  ((string *)local_4e0,&this->super_CompilerGLSL,*(uint32_t *)(_result_type + 2),
                   true);
        join<char_const(&)[14],char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_4c0,(spirv_cross *)"WavePrefixSum",(char (*) [14])0x5ac375,
                   (char (*) [2])local_4e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5b7d4b,
                   in_R9);
        emit_subgroup_op::anon_class_16_2_633b9ddf::operator()
                  (&local_4a0,(anon_class_16_2_633b9ddf *)&make_inclusive_Product.ops,&local_4c0);
        CompilerGLSL::emit_op
                  (&this->super_CompilerGLSL,uVar2,result_id,&local_4a0,(bool)(local_47d & 1),false)
        ;
        ::std::__cxx11::string::~string((string *)&local_4a0);
        ::std::__cxx11::string::~string((string *)&local_4c0);
        ::std::__cxx11::string::~string((string *)local_4e0);
        Compiler::inherit_expression_dependencies
                  ((Compiler *)this,result_id,*(uint32_t *)(_result_type + 2));
      }
      else {
        if (local_47c != 2) {
          if (local_47c != 3) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Invalid group operation.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar5,"Cannot trivially implement ClusteredReduce in HLSL.")
          ;
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        CompilerGLSL::emit_unary_func_op
                  (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)(_result_type + 2),
                   "WavePrefixSum");
      }
      break;
    case 0x15f:
      local_614 = *(uint32_t *)((long)_result_type + 0xc);
      if (local_614 == 0) {
        CompilerGLSL::emit_unary_func_op
                  (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)(_result_type + 2),
                   "WaveActiveProduct");
      }
      else if (local_614 == 1) {
        local_615 = CompilerGLSL::should_forward
                              (&this->super_CompilerGLSL,*(uint32_t *)(_result_type + 2));
        CompilerGLSL::to_expression_abi_cxx11_
                  ((string *)&operation_8,&this->super_CompilerGLSL,*(uint32_t *)(_result_type + 2),
                   true);
        join<char_const(&)[18],char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_658,(spirv_cross *)"WavePrefixProduct",(char (*) [18])0x5ac375,
                   (char (*) [2])&operation_8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5b7d4b,
                   in_R9);
        emit_subgroup_op::anon_class_16_2_633b9ddf::operator()
                  (&local_638,(anon_class_16_2_633b9ddf *)&int_type,&local_658);
        CompilerGLSL::emit_op
                  (&this->super_CompilerGLSL,uVar2,result_id,&local_638,(bool)(local_615 & 1),false)
        ;
        ::std::__cxx11::string::~string((string *)&local_638);
        ::std::__cxx11::string::~string((string *)&local_658);
        ::std::__cxx11::string::~string((string *)&operation_8);
        Compiler::inherit_expression_dependencies
                  ((Compiler *)this,result_id,*(uint32_t *)(_result_type + 2));
      }
      else {
        if (local_614 != 2) {
          if (local_614 != 3) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Invalid group operation.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar5,"Cannot trivially implement ClusteredReduce in HLSL.")
          ;
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        CompilerGLSL::emit_unary_func_op
                  (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)(_result_type + 2),
                   "WavePrefixProduct");
      }
      break;
    case 0x160:
      local_4e4 = *(uint32_t *)((long)_result_type + 0xc);
      if (local_4e4 == 0) {
        CompilerGLSL::emit_unary_func_op
                  (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)(_result_type + 2),
                   "WaveActiveProduct");
      }
      else if (local_4e4 == 1) {
        local_4e5 = CompilerGLSL::should_forward
                              (&this->super_CompilerGLSL,*(uint32_t *)(_result_type + 2));
        CompilerGLSL::to_expression_abi_cxx11_
                  ((string *)local_548,&this->super_CompilerGLSL,*(uint32_t *)(_result_type + 2),
                   true);
        join<char_const(&)[18],char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_528,(spirv_cross *)"WavePrefixProduct",(char (*) [18])0x5ac375,
                   (char (*) [2])local_548,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5b7d4b,
                   in_R9);
        emit_subgroup_op::anon_class_16_2_633b9ddf::operator()
                  (&local_508,(anon_class_16_2_633b9ddf *)&int_type,&local_528);
        CompilerGLSL::emit_op
                  (&this->super_CompilerGLSL,uVar2,result_id,&local_508,(bool)(local_4e5 & 1),false)
        ;
        ::std::__cxx11::string::~string((string *)&local_508);
        ::std::__cxx11::string::~string((string *)&local_528);
        ::std::__cxx11::string::~string((string *)local_548);
        Compiler::inherit_expression_dependencies
                  ((Compiler *)this,result_id,*(uint32_t *)(_result_type + 2));
      }
      else {
        if (local_4e4 != 2) {
          if (local_4e4 != 3) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Invalid group operation.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar5,"Cannot trivially implement ClusteredReduce in HLSL.")
          ;
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        CompilerGLSL::emit_unary_func_op
                  (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)(_result_type + 2),
                   "WavePrefixProduct");
      }
      break;
    case 0x161:
      if (*(uint32_t *)((long)_result_type + 0xc) != 0) {
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar5,"Invalid group operation.");
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op_cast
                (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)(_result_type + 2),
                 "WaveActiveMin",local_68,local_68);
      break;
    case 0x162:
      if (*(uint32_t *)((long)_result_type + 0xc) != 0) {
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar5,"Invalid group operation.");
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op_cast
                (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)(_result_type + 2),
                 "WaveActiveMin",local_6c,local_6c);
      break;
    case 0x163:
      local_54c = *(uint32_t *)((long)_result_type + 0xc);
      if (local_54c != 0) {
        if (local_54c != 3) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar5,"Invalid group operation.");
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar5,"Cannot trivially implement ClusteredReduce in HLSL.");
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)(_result_type + 2),
                 "WaveActiveMin");
      break;
    case 0x164:
      if (*(uint32_t *)((long)_result_type + 0xc) != 0) {
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar5,"Invalid group operation.");
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op_cast
                (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)(_result_type + 2),
                 "WaveActiveMax",local_68,local_68);
      break;
    case 0x165:
      if (*(uint32_t *)((long)_result_type + 0xc) != 0) {
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar5,"Invalid group operation.");
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op_cast
                (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)(_result_type + 2),
                 "WaveActiveMax",local_6c,local_6c);
      break;
    case 0x166:
      local_578 = *(uint32_t *)((long)_result_type + 0xc);
      if (local_578 != 0) {
        if (local_578 != 3) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar5,"Invalid group operation.");
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar5,"Cannot trivially implement ClusteredReduce in HLSL.");
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)(_result_type + 2),
                 "WaveActiveMax");
      break;
    case 0x167:
      if (*(uint32_t *)((long)_result_type + 0xc) != 0) {
        if (*(uint32_t *)((long)_result_type + 0xc) != 3) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar5,"Invalid group operation.");
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar5,"Cannot trivially implement ClusteredReduce in HLSL.");
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)(_result_type + 2),
                 "WaveActiveBitAnd");
      break;
    case 0x168:
      if (*(uint32_t *)((long)_result_type + 0xc) != 0) {
        if (*(uint32_t *)((long)_result_type + 0xc) != 3) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar5,"Invalid group operation.");
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar5,"Cannot trivially implement ClusteredReduce in HLSL.");
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)(_result_type + 2),
                 "WaveActiveBitOr");
      break;
    case 0x169:
      if (*(uint32_t *)((long)_result_type + 0xc) != 0) {
        if (*(uint32_t *)((long)_result_type + 0xc) != 3) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar5,"Invalid group operation.");
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar5,"Cannot trivially implement ClusteredReduce in HLSL.");
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)(_result_type + 2),
                 "WaveActiveBitXor");
      break;
    case 0x16a:
      if (*(uint32_t *)((long)_result_type + 0xc) != 0) {
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar5,"Invalid group operation.");
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op_cast
                (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)(_result_type + 2),
                 "WaveActiveBitAnd",local_6c,local_6c);
      break;
    case 0x16b:
      if (*(uint32_t *)((long)_result_type + 0xc) != 0) {
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar5,"Invalid group operation.");
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op_cast
                (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)(_result_type + 2),
                 "WaveActiveBitOr",local_6c,local_6c);
      break;
    case 0x16c:
      if (*(uint32_t *)((long)_result_type + 0xc) != 0) {
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar5,"Invalid group operation.");
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op_cast
                (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)(_result_type + 2),
                 "WaveActiveBitXor",local_6c,local_6c);
      break;
    case 0x16d:
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)((long)_result_type + 0xc),
                 *(uint32_t *)(_result_type + 2),"QuadReadLaneAt");
      break;
    case 0x16e:
      uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,*(uint32_t *)(_result_type + 2));
      if (uVar4 == 0) {
        CompilerGLSL::emit_unary_func_op
                  (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)((long)_result_type + 0xc)
                   ,"QuadReadAcrossX");
      }
      else if (uVar4 == 1) {
        CompilerGLSL::emit_unary_func_op
                  (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)((long)_result_type + 0xc)
                   ,"QuadReadAcrossY");
      }
      else {
        if (uVar4 != 2) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar5,"Invalid quad swap direction.");
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        CompilerGLSL::emit_unary_func_op
                  (&this->super_CompilerGLSL,uVar2,result_id,*(uint32_t *)((long)_result_type + 0xc)
                   ,"QuadReadAcrossDiagonal");
      }
      break;
    default:
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar5,"Invalid opcode for subgroup.");
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    CompilerGLSL::register_control_dependent_expression(&this->super_CompilerGLSL,result_id);
    return;
  }
  pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError(pCVar5,"Only subgroup scope is supported.");
  __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
}

Assistant:

void CompilerHLSL::emit_subgroup_op(const Instruction &i)
{
	if (hlsl_options.shader_model < 60)
		SPIRV_CROSS_THROW("Wave ops requires SM 6.0 or higher.");

	const uint32_t *ops = stream(i);
	auto op = static_cast<Op>(i.op);

	uint32_t result_type = ops[0];
	uint32_t id = ops[1];

	auto scope = static_cast<Scope>(evaluate_constant_u32(ops[2]));
	if (scope != ScopeSubgroup)
		SPIRV_CROSS_THROW("Only subgroup scope is supported.");

	const auto make_inclusive_Sum = [&](const string &expr) -> string {
		return join(expr, " + ", to_expression(ops[4]));
	};

	const auto make_inclusive_Product = [&](const string &expr) -> string {
		return join(expr, " * ", to_expression(ops[4]));
	};

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_instruction(i);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

#define make_inclusive_BitAnd(expr) ""
#define make_inclusive_BitOr(expr) ""
#define make_inclusive_BitXor(expr) ""
#define make_inclusive_Min(expr) ""
#define make_inclusive_Max(expr) ""

	switch (op)
	{
	case OpGroupNonUniformElect:
		emit_op(result_type, id, "WaveIsFirstLane()", true);
		break;

	case OpGroupNonUniformBroadcast:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "WaveReadLaneAt");
		break;

	case OpGroupNonUniformBroadcastFirst:
		emit_unary_func_op(result_type, id, ops[3], "WaveReadLaneFirst");
		break;

	case OpGroupNonUniformBallot:
		emit_unary_func_op(result_type, id, ops[3], "WaveActiveBallot");
		break;

	case OpGroupNonUniformInverseBallot:
		SPIRV_CROSS_THROW("Cannot trivially implement InverseBallot in HLSL.");

	case OpGroupNonUniformBallotBitExtract:
		SPIRV_CROSS_THROW("Cannot trivially implement BallotBitExtract in HLSL.");

	case OpGroupNonUniformBallotFindLSB:
		SPIRV_CROSS_THROW("Cannot trivially implement BallotFindLSB in HLSL.");

	case OpGroupNonUniformBallotFindMSB:
		SPIRV_CROSS_THROW("Cannot trivially implement BallotFindMSB in HLSL.");

	case OpGroupNonUniformBallotBitCount:
	{
		auto operation = static_cast<GroupOperation>(ops[3]);
		bool forward = should_forward(ops[4]);
		if (operation == GroupOperationReduce)
		{
			auto left = join("countbits(", to_enclosed_expression(ops[4]), ".x) + countbits(",
			                 to_enclosed_expression(ops[4]), ".y)");
			auto right = join("countbits(", to_enclosed_expression(ops[4]), ".z) + countbits(",
			                  to_enclosed_expression(ops[4]), ".w)");
			emit_op(result_type, id, join(left, " + ", right), forward);
			inherit_expression_dependencies(id, ops[4]);
		}
		else if (operation == GroupOperationInclusiveScan)
		{
			auto left = join("countbits(", to_enclosed_expression(ops[4]), ".x & gl_SubgroupLeMask.x) + countbits(",
			                 to_enclosed_expression(ops[4]), ".y & gl_SubgroupLeMask.y)");
			auto right = join("countbits(", to_enclosed_expression(ops[4]), ".z & gl_SubgroupLeMask.z) + countbits(",
			                  to_enclosed_expression(ops[4]), ".w & gl_SubgroupLeMask.w)");
			emit_op(result_type, id, join(left, " + ", right), forward);
			if (!active_input_builtins.get(BuiltInSubgroupLeMask))
			{
				active_input_builtins.set(BuiltInSubgroupLeMask);
				force_recompile_guarantee_forward_progress();
			}
		}
		else if (operation == GroupOperationExclusiveScan)
		{
			auto left = join("countbits(", to_enclosed_expression(ops[4]), ".x & gl_SubgroupLtMask.x) + countbits(",
			                 to_enclosed_expression(ops[4]), ".y & gl_SubgroupLtMask.y)");
			auto right = join("countbits(", to_enclosed_expression(ops[4]), ".z & gl_SubgroupLtMask.z) + countbits(",
			                  to_enclosed_expression(ops[4]), ".w & gl_SubgroupLtMask.w)");
			emit_op(result_type, id, join(left, " + ", right), forward);
			if (!active_input_builtins.get(BuiltInSubgroupLtMask))
			{
				active_input_builtins.set(BuiltInSubgroupLtMask);
				force_recompile_guarantee_forward_progress();
			}
		}
		else
			SPIRV_CROSS_THROW("Invalid BitCount operation.");
		break;
	}

	case OpGroupNonUniformShuffle:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "WaveReadLaneAt");
		break;
	case OpGroupNonUniformShuffleXor:
	{
		bool forward = should_forward(ops[3]);
		emit_op(ops[0], ops[1],
		        join("WaveReadLaneAt(", to_unpacked_expression(ops[3]), ", ",
		             "WaveGetLaneIndex() ^ ", to_enclosed_expression(ops[4]), ")"), forward);
		inherit_expression_dependencies(ops[1], ops[3]);
		break;
	}
	case OpGroupNonUniformShuffleUp:
	{
		bool forward = should_forward(ops[3]);
		emit_op(ops[0], ops[1],
		        join("WaveReadLaneAt(", to_unpacked_expression(ops[3]), ", ",
		             "WaveGetLaneIndex() - ", to_enclosed_expression(ops[4]), ")"), forward);
		inherit_expression_dependencies(ops[1], ops[3]);
		break;
	}
	case OpGroupNonUniformShuffleDown:
	{
		bool forward = should_forward(ops[3]);
		emit_op(ops[0], ops[1],
		        join("WaveReadLaneAt(", to_unpacked_expression(ops[3]), ", ",
		             "WaveGetLaneIndex() + ", to_enclosed_expression(ops[4]), ")"), forward);
		inherit_expression_dependencies(ops[1], ops[3]);
		break;
	}

	case OpGroupNonUniformAll:
		emit_unary_func_op(result_type, id, ops[3], "WaveActiveAllTrue");
		break;

	case OpGroupNonUniformAny:
		emit_unary_func_op(result_type, id, ops[3], "WaveActiveAnyTrue");
		break;

	case OpGroupNonUniformAllEqual:
		emit_unary_func_op(result_type, id, ops[3], "WaveActiveAllEqual");
		break;

	// clang-format off
#define HLSL_GROUP_OP(op, hlsl_op, supports_scan) \
case OpGroupNonUniform##op: \
	{ \
		auto operation = static_cast<GroupOperation>(ops[3]); \
		if (operation == GroupOperationReduce) \
			emit_unary_func_op(result_type, id, ops[4], "WaveActive" #hlsl_op); \
		else if (operation == GroupOperationInclusiveScan && supports_scan) \
        { \
			bool forward = should_forward(ops[4]); \
			emit_op(result_type, id, make_inclusive_##hlsl_op (join("WavePrefix" #hlsl_op, "(", to_expression(ops[4]), ")")), forward); \
			inherit_expression_dependencies(id, ops[4]); \
        } \
		else if (operation == GroupOperationExclusiveScan && supports_scan) \
			emit_unary_func_op(result_type, id, ops[4], "WavePrefix" #hlsl_op); \
		else if (operation == GroupOperationClusteredReduce) \
			SPIRV_CROSS_THROW("Cannot trivially implement ClusteredReduce in HLSL."); \
		else \
			SPIRV_CROSS_THROW("Invalid group operation."); \
		break; \
	}

#define HLSL_GROUP_OP_CAST(op, hlsl_op, type) \
case OpGroupNonUniform##op: \
	{ \
		auto operation = static_cast<GroupOperation>(ops[3]); \
		if (operation == GroupOperationReduce) \
			emit_unary_func_op_cast(result_type, id, ops[4], "WaveActive" #hlsl_op, type, type); \
		else \
			SPIRV_CROSS_THROW("Invalid group operation."); \
		break; \
	}

	HLSL_GROUP_OP(FAdd, Sum, true)
	HLSL_GROUP_OP(FMul, Product, true)
	HLSL_GROUP_OP(FMin, Min, false)
	HLSL_GROUP_OP(FMax, Max, false)
	HLSL_GROUP_OP(IAdd, Sum, true)
	HLSL_GROUP_OP(IMul, Product, true)
	HLSL_GROUP_OP_CAST(SMin, Min, int_type)
	HLSL_GROUP_OP_CAST(SMax, Max, int_type)
	HLSL_GROUP_OP_CAST(UMin, Min, uint_type)
	HLSL_GROUP_OP_CAST(UMax, Max, uint_type)
	HLSL_GROUP_OP(BitwiseAnd, BitAnd, false)
	HLSL_GROUP_OP(BitwiseOr, BitOr, false)
	HLSL_GROUP_OP(BitwiseXor, BitXor, false)
	HLSL_GROUP_OP_CAST(LogicalAnd, BitAnd, uint_type)
	HLSL_GROUP_OP_CAST(LogicalOr, BitOr, uint_type)
	HLSL_GROUP_OP_CAST(LogicalXor, BitXor, uint_type)

#undef HLSL_GROUP_OP
#undef HLSL_GROUP_OP_CAST
		// clang-format on

	case OpGroupNonUniformQuadSwap:
	{
		uint32_t direction = evaluate_constant_u32(ops[4]);
		if (direction == 0)
			emit_unary_func_op(result_type, id, ops[3], "QuadReadAcrossX");
		else if (direction == 1)
			emit_unary_func_op(result_type, id, ops[3], "QuadReadAcrossY");
		else if (direction == 2)
			emit_unary_func_op(result_type, id, ops[3], "QuadReadAcrossDiagonal");
		else
			SPIRV_CROSS_THROW("Invalid quad swap direction.");
		break;
	}

	case OpGroupNonUniformQuadBroadcast:
	{
		emit_binary_func_op(result_type, id, ops[3], ops[4], "QuadReadLaneAt");
		break;
	}

	default:
		SPIRV_CROSS_THROW("Invalid opcode for subgroup.");
	}

	register_control_dependent_expression(id);
}